

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O0

void proto3::TestEvilJson::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int32_t iVar2;
  TestEvilJson **v1;
  TestEvilJson **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  uint32_t *puVar4;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestEvilJson *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestEvilJson *from;
  TestEvilJson *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestEvilJson *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestEvilJson *)to_msg;
  _this = (TestEvilJson *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<proto3::TestEvilJson_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto3::TestEvilJson*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto3::TestEvilJson_const*,proto3::TestEvilJson*>(v1,v2,"&from != _this")
  ;
  if (local_30 == (Nullable<const_char_*>)0x0) {
    puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    uVar1 = *puVar4;
    if ((uVar1 & 0x7f) != 0) {
      if (((uVar1 & 1) != 0) &&
         (iVar2 = _internal_regular_value((TestEvilJson *)absl_log_internal_check_op_result),
         iVar2 != 0)) {
        (from->field_0)._impl_.regular_value_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0x18);
      }
      if (((uVar1 & 2) != 0) &&
         (iVar2 = _internal_script((TestEvilJson *)absl_log_internal_check_op_result), iVar2 != 0))
      {
        (from->field_0)._impl_.script_ = *(int32_t *)(absl_log_internal_check_op_result + 0x1c);
      }
      if (((uVar1 & 4) != 0) &&
         (iVar2 = _internal_quotes((TestEvilJson *)absl_log_internal_check_op_result), iVar2 != 0))
      {
        (from->field_0)._impl_.quotes_ = *(int32_t *)(absl_log_internal_check_op_result + 0x20);
      }
      if (((uVar1 & 8) != 0) &&
         (iVar2 = _internal_script_and_quotes((TestEvilJson *)absl_log_internal_check_op_result),
         iVar2 != 0)) {
        (from->field_0)._impl_.script_and_quotes_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0x24);
      }
      if (((uVar1 & 0x10) != 0) &&
         (iVar2 = _internal_empty_string((TestEvilJson *)absl_log_internal_check_op_result),
         iVar2 != 0)) {
        (from->field_0)._impl_.empty_string_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0x28);
      }
      if (((uVar1 & 0x20) != 0) &&
         (iVar2 = _internal_backslash((TestEvilJson *)absl_log_internal_check_op_result), iVar2 != 0
         )) {
        (from->field_0)._impl_.backslash_ = *(int32_t *)(absl_log_internal_check_op_result + 0x2c);
      }
      if (((uVar1 & 0x40) != 0) &&
         (iVar2 = _internal_low_codepoint((TestEvilJson *)absl_log_internal_check_op_result),
         iVar2 != 0)) {
        (from->field_0)._impl_.low_codepoint_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0x30);
      }
    }
    puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar4 = uVar1 | *puVar4;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/util/json_format_proto3.pb.cc"
             ,0x2d63,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void TestEvilJson::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestEvilJson*>(&to_msg);
  auto& from = static_cast<const TestEvilJson&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3.TestEvilJson)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_regular_value() != 0) {
        _this->_impl_.regular_value_ = from._impl_.regular_value_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_script() != 0) {
        _this->_impl_.script_ = from._impl_.script_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_quotes() != 0) {
        _this->_impl_.quotes_ = from._impl_.quotes_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_script_and_quotes() != 0) {
        _this->_impl_.script_and_quotes_ = from._impl_.script_and_quotes_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_empty_string() != 0) {
        _this->_impl_.empty_string_ = from._impl_.empty_string_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_backslash() != 0) {
        _this->_impl_.backslash_ = from._impl_.backslash_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_low_codepoint() != 0) {
        _this->_impl_.low_codepoint_ = from._impl_.low_codepoint_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}